

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ReportFailureInUnknownLocation(Type result_type,string *message)

{
  string local_48;
  allocator<char> local_21;
  
  UnitTest::GetInstance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_21);
  UnitTest::AddTestPartResult
            (&UnitTest::GetInstance::instance,result_type,(char *)0x0,-1,message,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ReportFailureInUnknownLocation(TestPartResult::Type result_type,
                                    const std::string& message) {
  // This function is a friend of UnitTest and as such has access to
  // AddTestPartResult.
  UnitTest::GetInstance()->AddTestPartResult(
      result_type,
      nullptr,  // No info about the source file where the exception occurred.
      -1,       // We have no info on which line caused the exception.
      message,
      "");  // No stack trace, either.
}